

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_tls.c
# Opt level: O3

int ssl_resend_hello_request(mbedtls_ssl_context *ssl)

{
  mbedtls_ssl_config *pmVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  ulong in_RAX;
  uint uVar5;
  undefined8 in_R9;
  
  pmVar1 = ssl->conf;
  if (pmVar1->renego_max_records < 0) {
    uVar3 = pmVar1->hs_timeout_max / pmVar1->hs_timeout_min;
    uVar5 = uVar3 + 1;
    uVar2 = 0x1f;
    if (uVar5 != 0) {
      for (; uVar5 >> uVar2 == 0; uVar2 = uVar2 - 1) {
      }
    }
    in_RAX = 1;
    if (uVar3 != 0xffffffff) {
      in_RAX = (ulong)((uVar2 ^ 0xffffffe0) + 0x22);
    }
    iVar4 = ssl->renego_records_seen;
    ssl->renego_records_seen = iVar4 + 1;
    if ((int)in_RAX <= iVar4) {
      mbedtls_debug_print_msg
                (ssl,2,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_tls.c"
                 ,0x882,"no longer retransmitting hello request",in_R9,in_RAX);
      return 0;
    }
  }
  mbedtls_debug_print_msg
            (ssl,2,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_tls.c"
             ,0x18d8,"=> write hello request",in_R9,in_RAX);
  ssl->out_msglen = 4;
  ssl->out_msgtype = 0x16;
  *ssl->out_msg = '\0';
  iVar4 = mbedtls_ssl_write_record(ssl);
  if (iVar4 == 0) {
    mbedtls_debug_print_msg
              (ssl,2,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_tls.c"
               ,0x18e4,"<= write hello request");
  }
  else {
    mbedtls_debug_print_ret
              (ssl,1,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_tls.c"
               ,0x18e0,"mbedtls_ssl_write_record",iVar4);
  }
  return iVar4;
}

Assistant:

static int ssl_resend_hello_request( mbedtls_ssl_context *ssl )
{
    /* If renegotiation is not enforced, retransmit until we would reach max
     * timeout if we were using the usual handshake doubling scheme */
    if( ssl->conf->renego_max_records < 0 )
    {
        uint32_t ratio = ssl->conf->hs_timeout_max / ssl->conf->hs_timeout_min + 1;
        unsigned char doublings = 1;

        while( ratio != 0 )
        {
            ++doublings;
            ratio >>= 1;
        }

        if( ++ssl->renego_records_seen > doublings )
        {
            MBEDTLS_SSL_DEBUG_MSG( 2, ( "no longer retransmitting hello request" ) );
            return( 0 );
        }
    }

    return( ssl_write_hello_request( ssl ) );
}